

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<int,kj::String>::Callbacks>::
insert<kj::HashMap<int,kj::String>::Entry,int&>
          (HashIndex<kj::HashMap<int,kj::String>::Callbacks> *this,
          ArrayPtr<kj::HashMap<int,_kj::String>::Entry> table,size_t pos,int *params)

{
  ArrayPtr<kj::HashMap<int,_kj::String>::Entry> table_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  StringPtr *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  HashIndex<kj::HashMap<int,_kj::String>::Callbacks> *this_00;
  int *in_R9;
  Maybe<unsigned_long> MVar6;
  ulong local_98;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *local_90;
  StringPtr *local_88;
  HashBucket local_78;
  HashBucket local_70;
  HashBucket *local_68;
  HashBucket *s;
  HashBucket *_s944;
  HashBucket *bucket;
  uint i;
  Maybe<kj::_::HashBucket_&> erasedSlot;
  uint hashCode;
  int *params_local;
  size_t pos_local;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::HashMap<int,_kj::String>::Entry> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.size_;
  this_00 = (HashIndex<kj::HashMap<int,_kj::String>::Callbacks> *)table.ptr;
  table_local.ptr = (StringPtr *)pos;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)(this_00 + 0x10));
  sVar4 = ArrayPtr<kj::HashMap<int,_kj::String>::Entry>::size
                    ((ArrayPtr<kj::HashMap<int,_kj::String>::Entry> *)&this_local);
  if (sVar3 << 1 < (sVar4 + 1 + *(long *)(this_00 + 8)) * 3) {
    sVar3 = ArrayPtr<kj::HashMap<int,_kj::String>::Entry>::size
                      ((ArrayPtr<kj::HashMap<int,_kj::String>::Entry> *)&this_local);
    HashIndex<kj::HashMap<int,_kj::String>::Callbacks>::rehash(this_00,(sVar3 + 1) * 3);
  }
  erasedSlot.ptr._4_4_ =
       HashMap<int,kj::String>::Callbacks::hashCode<int&>((Callbacks *)this_00,in_R9);
  Maybe<kj::_::HashBucket_&>::Maybe((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffb8);
  uVar2 = erasedSlot.ptr._4_4_;
  sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)(this_00 + 0x10));
  bucket._4_4_ = kj::_::chooseBucket(uVar2,(uint)sVar3);
  do {
    _s944 = Array<kj::_::HashBucket>::operator[]
                      ((Array<kj::_::HashBucket> *)(this_00 + 0x10),(ulong)bucket._4_4_);
    bVar1 = kj::_::HashBucket::isEmpty(_s944);
    if (bVar1) {
      s = kj::_::readMaybe<kj::_::HashBucket>
                    ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffb8);
      if (s == (HashBucket *)0x0) {
        kj::_::HashBucket::HashBucket(&local_78,erasedSlot.ptr._4_4_,(uint)params);
        *_s944 = local_78;
      }
      else {
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
        local_68 = s;
        kj::_::HashBucket::HashBucket(&local_70,erasedSlot.ptr._4_4_,(uint)params);
        *local_68 = local_70;
      }
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
      aVar5 = extraout_RDX;
LAB_00255475:
      MVar6.ptr.field_1.value = aVar5.value;
      MVar6.ptr._0_8_ = this;
      return (Maybe<unsigned_long>)MVar6.ptr;
    }
    bVar1 = kj::_::HashBucket::isErased(_s944);
    if (bVar1) {
      bVar1 = Maybe<kj::_::HashBucket_&>::operator==
                        ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffb8);
      if (bVar1) {
        Maybe<kj::_::HashBucket_&>::operator=
                  ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffb8,_s944);
      }
    }
    else if (_s944->hash == erasedSlot.ptr._4_4_) {
      local_90 = this_local;
      local_88 = table_local.ptr;
      table_00.size_ = (size_t)table_local.ptr;
      table_00.ptr = (StringPtr *)this_local;
      e = kj::_::HashBucket::getRow<kj::HashMap<int,kj::String>::Entry>(_s944,table_00);
      bVar1 = HashMap<int,kj::String>::Callbacks::matches<int&>((Callbacks *)this_00,e,in_R9);
      if (bVar1) {
        uVar2 = kj::_::HashBucket::getPos(_s944);
        local_98 = (ulong)uVar2;
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_98);
        aVar5 = extraout_RDX_00;
        goto LAB_00255475;
      }
    }
    sVar3 = kj::_::probeHash((Array<kj::_::HashBucket> *)(this_00 + 0x10),(ulong)bucket._4_4_);
    bucket._4_4_ = (uint)sVar3;
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }